

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

bool __thiscall QGuiApplicationPrivate::lastWindowClosed(QGuiApplicationPrivate *this)

{
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  QWindowPrivate *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QWindow_*> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::topLevelWindows();
  iVar2 = QList<QWindow_*>::begin((QList<QWindow_*> *)&QStack_38);
  iVar3 = QList<QWindow_*>::end((QList<QWindow_*> *)&QStack_38);
  for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
    pQVar4 = qt_window_private(*iVar2.i);
    cVar1 = (**(code **)(*(long *)pQVar4 + 0x50))(pQVar4);
    if (cVar1 != '\0') {
      cVar1 = (**(code **)(*(long *)pQVar4 + 0x58))(pQVar4);
      if (cVar1 != '\0') break;
    }
  }
  QArrayDataPointer<QWindow_*>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2.i == iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

bool QGuiApplicationPrivate::lastWindowClosed() const
{
    for (auto *window : QGuiApplication::topLevelWindows()) {
        auto *windowPrivate = qt_window_private(window);
        if (!windowPrivate->participatesInLastWindowClosed())
            continue;

        if (windowPrivate->treatAsVisible())
            return false;
     }

     return true;
}